

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall google::protobuf::FieldDescriptor::is_packed(FieldDescriptor *this)

{
  bool bVar1;
  
  bVar1 = is_packable(this);
  if (bVar1) {
    bVar1 = (this->merged_features_->field_0)._impl_.repeated_field_encoding_ == 1;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool FieldDescriptor::is_packed() const {
  if (!is_packable()) return false;
  return features().repeated_field_encoding() == FeatureSet::PACKED;
}